

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

uint32 __thiscall
Protocol::MQTT::Common::DynamicStringPair::readFrom
          (DynamicStringPair *this,uint8 *buffer,uint32 bufLength)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  
  uVar1 = DynamicString::readFrom(&this->key,buffer,bufLength);
  if (uVar1 < 0xfffffffd) {
    uVar2 = DynamicString::readFrom(&this->value,buffer + uVar1,bufLength - uVar1);
    uVar3 = 0;
    if (uVar2 < 0xfffffffd) {
      uVar3 = uVar1;
    }
    uVar1 = uVar3 + uVar2;
  }
  return uVar1;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    uint32 o = key.readFrom(buffer, bufLength);
                    if (isError(o)) return o;
                    uint32 s = value.readFrom(buffer + o, bufLength - o);
                    if (isError(s)) return s;
                    return s+o;
                }